

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

void recv_loop_cleanup(void *p)

{
  long lVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (p != (void *)0x0) {
    if ((void *)**p != (void *)0x0) {
      lrtr_free((void *)**p);
      **p = 0;
    }
    if ((void *)**(undefined8 **)((long)p + 8) != (void *)0x0) {
      lrtr_free((void *)**(undefined8 **)((long)p + 8));
      **(undefined8 **)((long)p + 8) = 0;
    }
    if ((void *)**(undefined8 **)((long)p + 0x10) != (void *)0x0) {
      lrtr_free((void *)**(undefined8 **)((long)p + 0x10));
      **(undefined8 **)((long)p + 0x10) = 0;
    }
    pvVar3 = (void *)**(long **)((long)p + 0x18);
    if (pvVar3 != (void *)0x0) {
      uVar2 = **(ulong **)((long)p + 0x20);
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          pvVar3 = *(void **)(**(long **)((long)p + 0x18) + uVar4 * 8);
          if (pvVar3 != (void *)0x0) {
            lrtr_free(pvVar3);
            uVar2 = **(ulong **)((long)p + 0x20);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar2);
        pvVar3 = (void *)**(undefined8 **)((long)p + 0x18);
      }
      lrtr_free(pvVar3);
      **(undefined8 **)((long)p + 0x18) = 0;
      **(undefined8 **)((long)p + 0x20) = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void recv_loop_cleanup(void *p)
{
	struct recv_loop_cleanup_args *args = p;

	if (!args)
		return;

	if (*args->ipv4_pdus) {
		lrtr_free(*args->ipv4_pdus);
		*args->ipv4_pdus = NULL;
	}

	if (*args->ipv6_pdus) {
		lrtr_free(*args->ipv6_pdus);
		*args->ipv6_pdus = NULL;
	}

	if (*args->router_key_pdus) {
		lrtr_free(*args->router_key_pdus);
		*args->router_key_pdus = NULL;
	}

	if (*args->aspa_pdus) {
		for (size_t i = 0; i < *args->aspa_pdu_count; i++) {
			if ((*args->aspa_pdus)[i])
				lrtr_free((*args->aspa_pdus)[i]);
		}

		lrtr_free(*args->aspa_pdus);
		*args->aspa_pdus = NULL;
		*args->aspa_pdu_count = 0;
	}
}